

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O1

void __thiscall duckdb::DictionaryDecoder::InitializePage(DictionaryDecoder *this)

{
  uint64_t *puVar1;
  byte bVar2;
  byte *pbVar3;
  _Head_base<0UL,_duckdb::RleBpDecoder_*,_false> _Var4;
  uint64_t req_len;
  ResizeableBuffer *pRVar5;
  ResizeableBuffer *pRVar6;
  _Head_base<0UL,_duckdb::RleBpDecoder_*,_false> this_00;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_01;
  
  this_01 = &this->reader->block;
  pRVar5 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  ByteBuffer::available(&pRVar5->super_ByteBuffer,1);
  pbVar3 = (pRVar5->super_ByteBuffer).ptr;
  bVar2 = *pbVar3;
  puVar1 = &(pRVar5->super_ByteBuffer).len;
  *puVar1 = *puVar1 - 1;
  (pRVar5->super_ByteBuffer).ptr = pbVar3 + 1;
  pRVar5 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  this_00._M_head_impl = (RleBpDecoder *)operator_new(0x40);
  RleBpDecoder::RleBpDecoder
            (this_00._M_head_impl,(pRVar5->super_ByteBuffer).ptr,
             (uint32_t)(pRVar6->super_ByteBuffer).len,(uint)bVar2);
  _Var4._M_head_impl =
       (this->dict_decoder).
       super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
       super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
  (this->dict_decoder).
  super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
  super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var4._M_head_impl != (RleBpDecoder *)0x0) {
    operator_delete(_Var4._M_head_impl);
  }
  pRVar5 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  req_len = (pRVar6->super_ByteBuffer).len;
  ByteBuffer::available(&pRVar5->super_ByteBuffer,req_len);
  puVar1 = &(pRVar5->super_ByteBuffer).len;
  *puVar1 = *puVar1 - req_len;
  (pRVar5->super_ByteBuffer).ptr = (pRVar5->super_ByteBuffer).ptr + req_len;
  return;
}

Assistant:

void DictionaryDecoder::InitializePage() {
	// where is it otherwise??
	auto &block = reader.block;
	auto dict_width = block->read<uint8_t>();
	dict_decoder = make_uniq<RleBpDecoder>(block->ptr, block->len, dict_width);
	block->inc(block->len);
}